

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<signed_char,_unsigned_char,_0>::Addition(char *lhs,uchar *rhs,char *result)

{
  char cVar1;
  int iVar2;
  undefined1 *in_RDX;
  byte *in_RSI;
  char *in_RDI;
  int32_t tmp;
  
  iVar2 = (int)*in_RDI + (uint)*in_RSI;
  cVar1 = std::numeric_limits<signed_char>::max();
  if (iVar2 <= cVar1) {
    *in_RDX = (char)iVar2;
  }
  return iVar2 <= cVar1;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        //16-bit or less unsigned addition
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return true;
        }

        return false;
    }